

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.h
# Opt level: O2

void __thiscall
pzgeom::TPZArc3D::X<double>
          (TPZArc3D *this,TPZFMatrix<double> *coord,TPZVec<double> *loc,TPZVec<double> *result)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  int j;
  long lVar4;
  long lVar5;
  int i;
  long lVar6;
  int i_1;
  double local_140;
  TPZManVector<double,_3> MappedBASE2D;
  TPZFNMatrix<4,_double> RotMatrix;
  
  RotMatrix.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&MappedBASE2D,3,(double *)&RotMatrix);
  TPZFNMatrix<4,_double>::TPZFNMatrix(&RotMatrix,2,2);
  dVar1 = this->fRadius;
  dVar1 = ((*loc->fStore + 1.0) * this->fAngle * dVar1) / (dVar1 + dVar1);
  dVar2 = cos(dVar1);
  pdVar3 = TPZFMatrix<double>::operator()(&RotMatrix.super_TPZFMatrix<double>,0,0);
  *pdVar3 = dVar2;
  dVar2 = sin(dVar1);
  pdVar3 = TPZFMatrix<double>::operator()(&RotMatrix.super_TPZFMatrix<double>,0,1);
  *pdVar3 = dVar2;
  dVar2 = sin(dVar1);
  pdVar3 = TPZFMatrix<double>::operator()(&RotMatrix.super_TPZFMatrix<double>,1,0);
  *pdVar3 = -dVar2;
  dVar1 = cos(dVar1);
  pdVar3 = TPZFMatrix<double>::operator()(&RotMatrix.super_TPZFMatrix<double>,1,1);
  *pdVar3 = dVar1;
  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
    local_140 = 0.0;
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      pdVar3 = TPZFMatrix<double>::operator()(&RotMatrix.super_TPZFMatrix<double>,lVar6,lVar4);
      local_140 = local_140 + *pdVar3 * (this->finitialVector).super_TPZVec<double>.fStore[lVar4];
    }
    MappedBASE2D.super_TPZVec<double>.fStore[lVar6] =
         local_140 + (double)(1 - (int)lVar6) * this->fXcenter + (double)(int)lVar6 * this->fYcenter
    ;
  }
  MappedBASE2D.super_TPZVec<double>.fStore[2] = 0.0;
  lVar6 = 0;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    pdVar3 = (double *)((long)(this->fIBaseCn).super_TPZFMatrix<double>.fElem + lVar6);
    local_140 = 0.0;
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      local_140 = local_140 + *pdVar3 * MappedBASE2D.super_TPZVec<double>.fStore[lVar5];
      pdVar3 = pdVar3 + (this->fIBaseCn).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                        super_TPZBaseMatrix.fRow;
    }
    pdVar3 = TPZFMatrix<double>::operator()(coord,lVar4,2);
    result->fStore[lVar4] = local_140 + *pdVar3;
    lVar6 = lVar6 + 8;
  }
  TPZFNMatrix<4,_double>::~TPZFNMatrix(&RotMatrix);
  TPZManVector<double,_3>::~TPZManVector(&MappedBASE2D);
  return;
}

Assistant:

void X(TPZFMatrix<REAL> &coord,TPZVec<T> &loc,TPZVec<T> &result) const
        {
            /** Computing initialVector = (iniR2 - CenterR2) */
            TPZManVector<T,3> MappedBASE2D(3,0.);
            
            TPZFNMatrix<4,T> RotMatrix(2,2);
            T deflection = fAngle * fRadius * (loc[0] + 1.) / (2.*fRadius);
            RotMatrix(0,0) =  cos(deflection); RotMatrix(0,1) = sin(deflection);
            RotMatrix(1,0) = -sin(deflection); RotMatrix(1,1) = cos(deflection);
            
            /** MappedPoint_R2 = centerCoord + vectorRotated , where Vx = RotationMatrix . Va */
            T centerCoord, vectRotated = 0.;
            for(int i = 0; i < 2; i++)
            {
                vectRotated = 0.;
                for(int j = 0; j < 2; j++) vectRotated += RotMatrix(i,j)*finitialVector[j];
                centerCoord = (1-i)*fXcenter + i*fYcenter;
                MappedBASE2D[i] = centerCoord + vectRotated;
            }
            
            /** Changing Basis of Obtained MappedPoint from R2 to R3 */
            MappedBASE2D[2] = 0.;
            for(int i = 0; i < 3; i++)
            {
                vectRotated = 0.;
                for(int j = 0; j < 3; j++)
                {
                    vectRotated += fIBaseCn.GetVal(i,j)*MappedBASE2D[j];
                }
                result[i] = vectRotated + coord(i,2);
            }

        }